

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

Fts5Auxiliary * fts5FindAuxiliary(Fts5FullTable *pTab,char *zName)

{
  Fts5Auxiliary *pFVar1;
  char *zRight;
  int iVar2;
  
  pFVar1 = pTab->pGlobal->pAux;
  while( true ) {
    if (pFVar1 == (Fts5Auxiliary *)0x0) {
      return (Fts5Auxiliary *)0x0;
    }
    zRight = pFVar1->zFunc;
    if (zName == (char *)0x0) {
      iVar2 = -(uint)(zRight != (char *)0x0);
    }
    else if (zRight == (char *)0x0) {
      iVar2 = 1;
    }
    else {
      iVar2 = sqlite3StrICmp(zName,zRight);
    }
    if (iVar2 == 0) break;
    pFVar1 = pFVar1->pNext;
  }
  return pFVar1;
}

Assistant:

static Fts5Auxiliary *fts5FindAuxiliary(Fts5FullTable *pTab, const char *zName){
  Fts5Auxiliary *pAux;

  for(pAux=pTab->pGlobal->pAux; pAux; pAux=pAux->pNext){
    if( sqlite3_stricmp(zName, pAux->zFunc)==0 ) return pAux;
  }

  /* No function of the specified name was found. Return 0. */
  return 0;
}